

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O0

HttpPost * __thiscall curlpp::HttpPost::operator=(HttpPost *this,Forms *posts)

{
  bool bVar1;
  FormPart *pFVar2;
  HttpPost *in_RDI;
  const_iterator pos;
  list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  *in_stack_ffffffffffffffb8;
  HttpPost *in_stack_ffffffffffffffc0;
  Forms *this_00;
  _Self in_stack_ffffffffffffffd0;
  _Self local_28;
  _List_node_base *local_20;
  _List_const_iterator<utilspp::clone_ptr<curlpp::FormPart>_> local_18 [3];
  
  clear(in_stack_ffffffffffffffc0);
  std::_List_const_iterator<utilspp::clone_ptr<curlpp::FormPart>_>::_List_const_iterator(local_18);
  local_20 = (_List_node_base *)
             std::__cxx11::
             list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
             ::begin(in_stack_ffffffffffffffb8);
  local_18[0]._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=(local_18,&local_28);
    if (!bVar1) break;
    this_00 = &in_RDI->mForms;
    std::_List_const_iterator<utilspp::clone_ptr<curlpp::FormPart>_>::operator*
              ((_List_const_iterator<utilspp::clone_ptr<curlpp::FormPart>_> *)this_00);
    std::__cxx11::
    list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
    ::push_back((list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
                 *)in_stack_ffffffffffffffd0._M_node,(value_type *)in_RDI);
    std::__cxx11::
    list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
    ::back(this_00);
    pFVar2 = utilspp::clone_ptr<curlpp::FormPart>::operator->
                       ((clone_ptr<curlpp::FormPart> *)in_stack_ffffffffffffffd0._M_node);
    (*pFVar2->_vptr_FormPart[3])(pFVar2,in_RDI,&in_RDI->mLast);
    in_stack_ffffffffffffffd0 =
         std::_List_const_iterator<utilspp::clone_ptr<curlpp::FormPart>_>::operator++(local_18,0);
  }
  return in_RDI;
}

Assistant:

curlpp::HttpPost &
curlpp::HttpPost::operator=(const Forms & posts)
{
  clear();

  Forms::const_iterator pos;
  for(pos = posts.begin(); pos != posts.end(); pos++) 
  {
    mForms.push_back(*pos);
    mForms.back()->add(&mFirst, &mLast);
  } 

  return (*this);
}